

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeRelease(Rtree *pRtree)

{
  u32 *puVar1;
  sqlite3_blob *pBlob;
  
  puVar1 = &pRtree->nBusy;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  pRtree->inWrTrans = '\0';
  pBlob = pRtree->pNodeBlob;
  pRtree->pNodeBlob = (sqlite3_blob *)0x0;
  sqlite3_blob_close(pBlob);
  sqlite3_finalize(pRtree->pWriteNode);
  sqlite3_finalize(pRtree->pDeleteNode);
  sqlite3_finalize(pRtree->pReadRowid);
  sqlite3_finalize(pRtree->pWriteRowid);
  sqlite3_finalize(pRtree->pDeleteRowid);
  sqlite3_finalize(pRtree->pReadParent);
  sqlite3_finalize(pRtree->pWriteParent);
  sqlite3_finalize(pRtree->pDeleteParent);
  sqlite3_finalize(pRtree->pWriteAux);
  sqlite3_free(pRtree->zReadAuxSql);
  sqlite3_free(pRtree);
  return;
}

Assistant:

static void rtreeRelease(Rtree *pRtree){
  pRtree->nBusy--;
  if( pRtree->nBusy==0 ){
    pRtree->inWrTrans = 0;
    assert( pRtree->nCursor==0 );
    nodeBlobReset(pRtree);
    assert( pRtree->nNodeRef==0 || pRtree->bCorrupt );
    sqlite3_finalize(pRtree->pWriteNode);
    sqlite3_finalize(pRtree->pDeleteNode);
    sqlite3_finalize(pRtree->pReadRowid);
    sqlite3_finalize(pRtree->pWriteRowid);
    sqlite3_finalize(pRtree->pDeleteRowid);
    sqlite3_finalize(pRtree->pReadParent);
    sqlite3_finalize(pRtree->pWriteParent);
    sqlite3_finalize(pRtree->pDeleteParent);
    sqlite3_finalize(pRtree->pWriteAux);
    sqlite3_free(pRtree->zReadAuxSql);
    sqlite3_free(pRtree);
  }
}